

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
double_writer::operator()(double_writer *this,char **it)

{
  double_writer dVar1;
  double_writer *pdVar2;
  size_t __n;
  char *__dest;
  ptrdiff_t _Num;
  
  dVar1 = this[8];
  if (dVar1 != (double_writer)0x0) {
    pdVar2 = (double_writer *)*it;
    *it = (char *)(pdVar2 + 1);
    *pdVar2 = dVar1;
    *(long *)this = *(long *)this + -1;
  }
  __n = *(size_t *)(*(long *)(this + 0x10) + 0x10);
  __dest = *it;
  if (__n != 0) {
    memmove(__dest,*(void **)(*(long *)(this + 0x10) + 8),__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }